

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

unique_ptr<ninx::parser::element::FunctionCall,_std::default_delete<ninx::parser::element::FunctionCall>_>
 __thiscall ninx::parser::Parser::parse_operator_call(Parser *this,char limiter)

{
  char cVar1;
  int iVar2;
  mapped_type *pmVar3;
  char in_DL;
  undefined7 in_register_00000031;
  Parser *this_00;
  bool local_160 [15];
  undefined1 local_151;
  unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
  local_150;
  value_type local_148;
  __single_object argument;
  vector<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
  arguments;
  mapped_type name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  undefined1 local_a0 [8];
  unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_> body;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  char local_19;
  Parser *pPStack_18;
  char limiter_local;
  Parser *this_local;
  __single_object *function_call;
  
  this_00 = (Parser *)CONCAT71(in_register_00000031,limiter);
  local_19 = in_DL;
  pPStack_18 = this_00;
  this_local = this;
  iVar2 = TokenReader::check_limiter(&this_00->reader,in_DL);
  cVar1 = local_19;
  if (iVar2 != 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_80,1,cVar1,(allocator *)&stack0xffffffffffffff7f);
    std::operator+(&local_60,"Expected operator \'",&local_80);
    std::operator+(&local_40,&local_60,"\', but could not find one.");
    generate_exception(this_00,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff7f);
  }
  TokenReader::get_token(&this_00->reader);
  parse_implicit_block_until((Parser *)local_a0,limiter);
  iVar2 = TokenReader::check_limiter(&this_00->reader,local_19);
  if (iVar2 != 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_100,1,local_19,(allocator *)(name.field_2._M_local_buf + 0xf));
    std::operator+(&local_e0,"Expected closing operator \'",&local_100);
    std::operator+(&local_c0,&local_e0,"\', but could not find one.");
    generate_exception(this_00,&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_100);
    std::allocator<char>::~allocator((allocator<char> *)(name.field_2._M_local_buf + 0xf));
  }
  TokenReader::get_token(&this_00->reader);
  pmVar3 = std::
           unordered_map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::at(&this_00->operators,&local_19);
  std::__cxx11::string::string
            ((string *)
             &arguments.
              super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)pmVar3);
  std::
  vector<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
  ::vector((vector<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
            *)&argument);
  std::make_unique<std::__cxx11::string,char_const(&)[5]>((char (*) [5])&local_150);
  std::
  make_unique<ninx::parser::element::FunctionCallArgument,std::unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>>,std::unique_ptr<ninx::parser::element::Block,std::default_delete<ninx::parser::element::Block>>>
            ((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_148,&local_150);
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_150);
  std::
  vector<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
  ::push_back((vector<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
               *)&argument,&local_148);
  local_151 = 0;
  local_160[0] = false;
  local_160[1] = false;
  local_160[2] = false;
  local_160[3] = false;
  local_160[4] = false;
  local_160[5] = false;
  local_160[6] = false;
  local_160[7] = false;
  std::
  make_unique<ninx::parser::element::FunctionCall,std::__cxx11::string&,std::vector<std::unique_ptr<ninx::parser::element::FunctionCallArgument,std::default_delete<ninx::parser::element::FunctionCallArgument>>,std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,std::default_delete<ninx::parser::element::FunctionCallArgument>>>>,decltype(nullptr),bool>
            (&this->origin,
             (vector<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
              *)&arguments.
                 super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,(void **)&argument,local_160);
  local_151 = 1;
  std::
  unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
  ::~unique_ptr(&local_148);
  std::
  vector<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
  ::~vector((vector<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
             *)&argument);
  std::__cxx11::string::~string
            ((string *)
             &arguments.
              super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
  ::~unique_ptr((unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
                 *)local_a0);
  return (__uniq_ptr_data<ninx::parser::element::FunctionCall,_std::default_delete<ninx::parser::element::FunctionCall>,_true,_true>
          )(__uniq_ptr_data<ninx::parser::element::FunctionCall,_std::default_delete<ninx::parser::element::FunctionCall>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<FunctionCall> ninx::parser::Parser::parse_operator_call(char limiter) {
    if (reader.check_limiter(limiter) != 1) {
        generate_exception("Expected operator '" + std::string(1, limiter) + "', but could not find one.");
    }
    reader.get_token();

    auto body {parse_implicit_block_until(limiter)};

    if (reader.check_limiter(limiter) != 1) {
        generate_exception("Expected closing operator '" + std::string(1, limiter) + "', but could not find one.");
    }
    reader.get_token();

    // Get the name of the function the operator refers to
    auto name {operators.at(limiter)};

    // Create the function call
    std::vector<std::unique_ptr<FunctionCallArgument>> arguments;
    auto argument = std::make_unique<FunctionCallArgument>(std::make_unique<std::string>("body"), std::move(body));
    arguments.push_back(std::move(argument));

    auto function_call = std::make_unique<FunctionCall>(name, std::move(arguments),
                                                        nullptr, false);

    return function_call;
}